

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void init_dsmotion_compensation(search_site_config *cfg,int stride,int level)

{
  int iVar1;
  bool bVar2;
  int radius;
  uint uVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  undefined1 auVar8 [16];
  int local_48;
  ushort local_44;
  undefined2 uStack_42;
  ushort local_40;
  undefined2 local_3e;
  undefined1 local_3c [16];
  ushort local_2c;
  ushort local_2a;
  ushort local_28;
  ushort local_26;
  
  cfg->site[10][0].mv.row = 0;
  cfg->site[10][0].mv.col = 0;
  cfg->site[10][0].offset = 0;
  cfg->stride = stride;
  uVar3 = 0x400;
  if (0 < level) {
    uVar3 = 0x100;
  }
  piVar6 = &cfg->site[10][0].offset;
  iVar5 = 0;
  lVar7 = 10;
  for (; uVar3 != 0; uVar3 = uVar3 >> (bVar2 || level == 0)) {
    local_48 = 0;
    local_40 = (ushort)uVar3;
    local_44 = -local_40;
    uStack_42 = 0;
    local_3e = 0;
    auVar8._8_4_ = (int)((ulong)local_44 << 0x10);
    auVar8._0_8_ = (ulong)local_44 << 0x10 | (ulong)local_40 << 0x30;
    auVar8._12_4_ = (int)(((ulong)local_40 << 0x30) >> 0x20);
    local_3c = pshufhw(auVar8,auVar8,0xf5);
    local_2c = local_44;
    local_2a = local_40;
    local_28 = local_40;
    local_26 = local_44;
    for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
      iVar1 = (&local_48)[lVar4];
      piVar6[lVar4 * 2 + -1] = iVar1;
      piVar6[lVar4 * 2] = (iVar1 >> 0x10) + (short)iVar1 * stride;
    }
    cfg->searches_per_step[lVar7] = 8;
    cfg->radius[lVar7] = uVar3;
    bVar2 = lVar7 < 9;
    lVar7 = lVar7 + -1;
    iVar5 = iVar5 + 1;
    piVar6 = piVar6 + -0x22;
  }
  cfg->num_search_steps = iVar5;
  return;
}

Assistant:

static void init_dsmotion_compensation(search_site_config *cfg, int stride,
                                       int level) {
  int num_search_steps = 0;
  int stage_index = MAX_MVSEARCH_STEPS - 1;

  cfg->site[stage_index][0].mv.col = cfg->site[stage_index][0].mv.row = 0;
  cfg->site[stage_index][0].offset = 0;
  cfg->stride = stride;

  // Choose the initial step size depending on level.
  const int first_step = (level > 0) ? (MAX_FIRST_STEP / 4) : MAX_FIRST_STEP;

  for (int radius = first_step; radius > 0;) {
    int num_search_pts = 8;

    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },           { -radius, 0 },      { radius, 0 },
      { 0, -radius },     { 0, radius },       { -radius, -radius },
      { radius, radius }, { -radius, radius }, { radius, -radius },
    };

    int i;
    for (i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    // Update the search radius based on level.
    if (!level || ((stage_index < 9) && level)) radius /= 2;
    --stage_index;
    ++num_search_steps;
  }
  cfg->num_search_steps = num_search_steps;
}